

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructGet
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructGet *curr,
          optional<wasm::HeapType> ht)

{
  bool bVar1;
  Expression **childp;
  HeapType *pHVar2;
  Type local_38;
  HeapType local_30;
  StructGet *local_28;
  StructGet *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ht_local;
  
  this_local = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_28 = curr;
  curr_local = (StructGet *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    local_30 = wasm::Type::getHeapType(&local_28->ref->type);
    std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&this_local,&local_30);
  }
  childp = &local_28->ref;
  pHVar2 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
  wasm::Type::Type(&local_38,(HeapType)pHVar2->id,Nullable,Inexact);
  note(this,childp,local_38);
  return;
}

Assistant:

void visitStructGet(StructGet* curr,
                      std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    note(&curr->ref, Type(*ht, Nullable));
  }